

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::FormatCountableNoun_abi_cxx11_
          (string *__return_storage_ptr__,testing *this,int count,char *singular_form,
          char *plural_form)

{
  undefined4 in_register_00000014;
  int local_64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  local_64 = (int)this;
  internal::StreamableToString<int>(&local_40,&local_64);
  std::operator+(&local_60,&local_40," ");
  if (local_64 == 1) {
    singular_form = (char *)CONCAT44(in_register_00000014,count);
  }
  std::operator+(__return_storage_ptr__,&local_60,singular_form);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::string FormatCountableNoun(int count, const char* singular_form,
                                       const char* plural_form) {
  return internal::StreamableToString(count) + " " +
         (count == 1 ? singular_form : plural_form);
}